

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall
crypto_tests::CryptoTest::TestHKDF_SHA256_32
          (CryptoTest *this,string *ikm_hex,string *salt_hex,string *info_hex,string *okm_check_hex)

{
  long lVar1;
  string *psVar2;
  iterator in_R9;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  const_string file;
  Span<const_unsigned_char> s;
  const_string msg;
  check_type cVar3;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  lazy_ostream local_168;
  undefined1 *local_158;
  char **local_150;
  assertion_result local_148;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  vector<unsigned_char,_std::allocator<unsigned_char>_> info;
  vector<unsigned_char,_std::allocator<unsigned_char>_> salt;
  vector<unsigned_char,_std::allocator<unsigned_char>_> initial_key_material;
  string local_c8;
  uchar out [32];
  CHKDF_HMAC_SHA256_L32 hkdf32;
  string info_stringified;
  string salt_stringified;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (ikm_hex->_M_dataplus)._M_p;
  hex_str._M_len = ikm_hex->_M_string_length;
  psVar2 = okm_check_hex;
  ParseHex<unsigned_char>(&initial_key_material,hex_str);
  hex_str_00._M_str = (salt_hex->_M_dataplus)._M_p;
  hex_str_00._M_len = salt_hex->_M_string_length;
  ParseHex<unsigned_char>(&salt,hex_str_00);
  hex_str_01._M_str = (info_hex->_M_dataplus)._M_p;
  hex_str_01._M_len = info_hex->_M_string_length;
  ParseHex<unsigned_char>(&info,hex_str_01);
  salt_stringified._M_dataplus._M_p = (pointer)&salt_stringified.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&salt_stringified,
             salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  info_stringified._M_dataplus._M_p = (pointer)&info_stringified.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&info_stringified,
             info.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             info.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  CHKDF_HMAC_SHA256_L32::CHKDF_HMAC_SHA256_L32
            (&hkdf32,initial_key_material.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
             (long)initial_key_material.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)initial_key_material.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,&salt_stringified);
  CHKDF_HMAC_SHA256_L32::Expand32(&hkdf32,&info_stringified,out);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x162;
  file.m_begin = (iterator)&local_120;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)psVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_130,msg);
  s.m_size = 0x20;
  s.m_data = out;
  HexStr_abi_cxx11_(&local_c8,s);
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)std::operator==(&local_c8,okm_check_hex);
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_150 = &local_178;
  local_178 = "HexStr(out) == okm_check_hex";
  local_170 = "";
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_180 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_168,1,0,WARN,_cVar3,(size_t)&local_188,0x162);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&info_stringified);
  std::__cxx11::string::~string((string *)&salt_stringified);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&info.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&initial_key_material.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            );
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestHKDF_SHA256_32(const std::string &ikm_hex, const std::string &salt_hex, const std::string &info_hex, const std::string &okm_check_hex) {
    std::vector<unsigned char> initial_key_material = ParseHex(ikm_hex);
    std::vector<unsigned char> salt = ParseHex(salt_hex);
    std::vector<unsigned char> info = ParseHex(info_hex);


    // our implementation only supports strings for the "info" and "salt", stringify them
    std::string salt_stringified(reinterpret_cast<char*>(salt.data()), salt.size());
    std::string info_stringified(reinterpret_cast<char*>(info.data()), info.size());

    CHKDF_HMAC_SHA256_L32 hkdf32(initial_key_material.data(), initial_key_material.size(), salt_stringified);
    unsigned char out[32];
    hkdf32.Expand32(info_stringified, out);
    BOOST_CHECK(HexStr(out) == okm_check_hex);
}